

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getnameinfo.c
# Opt level: O2

int run_test_getnameinfo_basic_ip6(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_10;
  
  iVar1 = uv_ip6_addr("::1",0x50,&addr6);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_getnameinfo(puVar2,&req,getnameinfo_req,(sockaddr *)&addr6,0);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      close_loop(puVar2);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      pcVar3 = "0 == uv_loop_close(uv_default_loop())";
      uStack_10 = 99;
    }
    else {
      pcVar3 = "r == 0";
      uStack_10 = 0x5f;
    }
  }
  else {
    pcVar3 = "r == 0";
    uStack_10 = 0x58;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getnameinfo.c"
          ,uStack_10,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(getnameinfo_basic_ip6) {
  int r;

  r = uv_ip6_addr(address_ip6, port, &addr6);
  ASSERT(r == 0);

  r = uv_getnameinfo(uv_default_loop(),
                     &req,
                     &getnameinfo_req,
                     (const struct sockaddr*)&addr6,
                     0);
  ASSERT(r == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}